

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

shared_ptr<Token> __thiscall
Parser::expect(Parser *this,TokenType type,bool *error,string *errorMessage)

{
  int iVar1;
  size_t *psVar2;
  element_type *peVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *in_R8;
  bool bVar7;
  bool bVar8;
  shared_ptr<Token> sVar9;
  undefined1 local_f0 [24];
  element_type *local_d8;
  undefined1 local_d0 [24];
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  shared_ptr<Token> *token;
  shared_ptr<Token> local_90;
  long *local_80;
  TokenBuffer local_78;
  _List_node_base *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _List_node_base local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_78.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = (int)error;
  bVar7 = false;
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)errorMessage;
  local_a8 = (element_type *)this;
  local_80 = in_R8;
  while( true ) {
    TokenBuffer::currentToken((TokenBuffer *)&local_50);
    bVar8 = true;
    if (*(int *)&local_50[2]._M_next != 1) {
      TokenBuffer::currentToken(&local_78);
      bVar8 = *(int *)&local_78.tokenList.
                       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[2]._M_next !=
              local_78.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.tokenList.
          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl
          ._M_node.super__List_node_base._M_prev !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.tokenList.
                   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev);
      }
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (!bVar8) break;
    *(undefined1 *)&((_Alloc_hider *)&(local_b0._M_pi)->_vptr__Sp_counted_base)->_M_p = 1;
    if (!bVar7) {
      TokenBuffer::currentToken((TokenBuffer *)&local_50);
      iVar1 = *(int *)&local_50[2]._M_next;
      psVar2 = (size_t *)
               ((long)&local_78.tokenList.
                       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
               + 0x10);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if (iVar1 == 1) {
        TokenBuffer::currentToken(&local_78);
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,*local_80,local_80[1] + *local_80);
        std::__cxx11::string::append((char *)&local_50);
        reportError((Parser *)CONCAT44(in_register_00000034,type),(shared_ptr<Token> *)&local_78,
                    (string *)&local_50);
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_78.tokenList.
                  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev;
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)((long)&(local_40._M_next)->_M_next + 1));
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_78.tokenList.
                    super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev;
        }
      }
      else {
        TokenBuffer::currentToken((TokenBuffer *)local_d0);
        token = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&token,*local_80,local_80[1] + *local_80);
        std::__cxx11::string::append((char *)&token);
        TokenBuffer::currentToken((TokenBuffer *)(local_d0 + 0x10));
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&token,*(ulong *)local_d0._16_8_);
        p_Var5 = (_List_node_base *)(plVar4 + 2);
        if ((_List_node_base *)*plVar4 == p_Var5) {
          local_78.tokenList.
          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl
          ._M_node._M_size = (size_t)p_Var5->_M_next;
          local_78.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)plVar4[3];
          local_78.tokenList.
          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
        }
        else {
          local_78.tokenList.
          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl
          ._M_node._M_size = (size_t)p_Var5->_M_next;
          local_78.tokenList.
          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl
          ._M_node.super__List_node_base._M_next = (_List_node_base *)*plVar4;
        }
        local_78.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar4[1];
        *plVar4 = (long)p_Var5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
        p_Var5 = (_List_node_base *)(plVar4 + 2);
        if ((_List_node_base *)*plVar4 == p_Var5) {
          local_40._M_next = p_Var5->_M_next;
          local_40._M_prev = (_List_node_base *)plVar4[3];
          local_50 = &local_40;
        }
        else {
          local_40._M_next = p_Var5->_M_next;
          local_50 = (_List_node_base *)*plVar4;
        }
        local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
        *plVar4 = (long)p_Var5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        reportError((Parser *)CONCAT44(in_register_00000034,type),(shared_ptr<Token> *)local_d0,
                    (string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)((long)&(local_40._M_next)->_M_next + 1));
        }
        if (local_78.tokenList.
            super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
            _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
          operator_delete(local_78.tokenList.
                          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,
                          (ulong)((long)(_List_node_base **)
                                        local_78.tokenList.
                                        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                                        ._M_impl._M_node._M_size + 1));
        }
        if (local_b8 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8);
        }
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
        if (token != &local_90) {
          operator_delete(token,(ulong)((long)&((local_90.
                                                 super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->value)._M_dataplus._M_p + 1));
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    TokenBuffer::currentToken((TokenBuffer *)&local_50);
    iVar1 = *(int *)&local_50[2]._M_next;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (iVar1 == 1) break;
    TokenBuffer::nextToken((TokenBuffer *)(local_f0 + 0x10));
    bVar7 = true;
    if (local_d8 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8);
    }
  }
  peVar3 = local_a8;
  TokenBuffer::currentToken((TokenBuffer *)local_a8);
  sVar9 = TokenBuffer::nextToken((TokenBuffer *)local_f0);
  _Var6 = sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
    _Var6._M_pi = extraout_RDX;
  }
  sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  return (shared_ptr<Token>)sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token>
Parser::expect(TokenType type, bool & error, const std::string & errorMessage) noexcept {
  bool foundWrongToken = false;

  while (true) {
    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile
        || this->tokenBuffer->currentToken()->tokenType != type) {
      error = true;

      // if this is our first error, report it
      if (!foundWrongToken) {
        if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
          this->reportError(this->tokenBuffer->currentToken(), errorMessage + ".");
        } else {
          this->reportError(this->tokenBuffer->currentToken(),
            errorMessage + ", but was '" + this->tokenBuffer->currentToken()->value + "'.");
        }
      }

      foundWrongToken = true;

      if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
        break;
      }

      this->tokenBuffer->nextToken();

    } else {
      break;
    }
  }

  auto token = this->tokenBuffer->currentToken();

  this->tokenBuffer->nextToken();

  return token;
}